

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::columnsRemoved
          (QAbstractItemViewPrivate *this,QModelIndex *index,int start,int end)

{
  SizeAdjustPolicy SVar1;
  long *plVar2;
  char cVar3;
  long in_FS_OFFSET;
  QAccessibleTableModelChangeEvent accessibleEvent;
  code *local_68;
  undefined8 uStack_60;
  long *local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  int iStack_44;
  undefined4 uStack_40;
  int iStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  if ((*(byte *)(plVar2[4] + 9) & 0x80) != 0) {
    (**(code **)(*plVar2 + 0x260))(plVar2);
  }
  *(undefined4 *)(plVar2[1] + 0x3a8) = 0;
  cVar3 = QAccessible::isActive();
  if (cVar3 != '\0') {
    uStack_50 = 0x5ffffffff;
    local_68 = QIcon::QIcon;
    local_48 = 0xffffffff;
    uStack_40 = 0xffffffff;
    uStack_60 = 0xaaaaaaaa00000116;
    local_58 = plVar2;
    iStack_44 = start;
    iStack_3c = end;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)&local_68);
  }
  SVar1 = (this->super_QAbstractScrollAreaPrivate).sizeAdjustPolicy;
  if ((SVar1 != AdjustIgnored) &&
     ((SVar1 == AdjustToContents || ((this->super_QAbstractScrollAreaPrivate).shownOnce == false))))
  {
    QWidget::updateGeometry
              (*(QWidget **)
                &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                 field_0x8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::columnsRemoved(const QModelIndex &index, int start, int end)
{
    Q_UNUSED(index);
    Q_UNUSED(start);
    Q_UNUSED(end);

    Q_Q(QAbstractItemView);
    if (q->isVisible())
        q->updateEditorGeometries();
    q->setState(QAbstractItemView::NoState);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(q, QAccessibleTableModelChangeEvent::ColumnsRemoved);
        accessibleEvent.setFirstColumn(start);
        accessibleEvent.setLastColumn(end);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    updateGeometry();
}